

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

cJSON_bool parse_value(cJSON *item,parse_buffer *input_buffer)

{
  int iVar1;
  long *in_RSI;
  long in_RDI;
  parse_buffer *in_stack_00000020;
  cJSON *in_stack_00000028;
  parse_buffer *in_stack_00000050;
  cJSON *in_stack_00000058;
  cJSON_bool local_4;
  
  if ((in_RSI == (long *)0x0) || (*in_RSI == 0)) {
    local_4 = 0;
  }
  else {
    if (((in_RSI != (long *)0x0) && (in_RSI[2] + 4U <= (ulong)in_RSI[1])) &&
       (iVar1 = strncmp((char *)(*in_RSI + in_RSI[2]),"null",4), iVar1 == 0)) {
      *(undefined4 *)(in_RDI + 0x18) = 4;
      in_RSI[2] = in_RSI[2] + 4;
      return 1;
    }
    if (((in_RSI != (long *)0x0) && (in_RSI[2] + 5U <= (ulong)in_RSI[1])) &&
       (iVar1 = strncmp((char *)(*in_RSI + in_RSI[2]),"false",5), iVar1 == 0)) {
      *(undefined4 *)(in_RDI + 0x18) = 1;
      in_RSI[2] = in_RSI[2] + 5;
      return 1;
    }
    if (((in_RSI != (long *)0x0) && (in_RSI[2] + 4U <= (ulong)in_RSI[1])) &&
       (iVar1 = strncmp((char *)(*in_RSI + in_RSI[2]),"true",4), iVar1 == 0)) {
      *(undefined4 *)(in_RDI + 0x18) = 2;
      *(undefined4 *)(in_RDI + 0x28) = 1;
      in_RSI[2] = in_RSI[2] + 4;
      return 1;
    }
    if (((in_RSI == (long *)0x0) || ((ulong)in_RSI[1] <= (ulong)in_RSI[2])) ||
       (*(char *)(*in_RSI + in_RSI[2]) != '\"')) {
      if (((in_RSI == (long *)0x0) || ((ulong)in_RSI[1] <= (ulong)in_RSI[2])) ||
         ((*(char *)(*in_RSI + in_RSI[2]) != '-' &&
          ((*(byte *)(*in_RSI + in_RSI[2]) < 0x30 || (0x39 < *(byte *)(*in_RSI + in_RSI[2]))))))) {
        if ((in_RSI == (long *)0x0) ||
           (((ulong)in_RSI[1] <= (ulong)in_RSI[2] || (*(char *)(*in_RSI + in_RSI[2]) != '[')))) {
          if ((in_RSI == (long *)0x0) ||
             (((ulong)in_RSI[1] <= (ulong)in_RSI[2] || (*(char *)(*in_RSI + in_RSI[2]) != '{')))) {
            local_4 = 0;
          }
          else {
            local_4 = parse_object(item,input_buffer);
          }
        }
        else {
          local_4 = parse_array(item,input_buffer);
        }
      }
      else {
        local_4 = parse_number(in_stack_00000058,in_stack_00000050);
      }
    }
    else {
      local_4 = parse_string(in_stack_00000028,in_stack_00000020);
    }
  }
  return local_4;
}

Assistant:

static cJSON_bool parse_value(cJSON * const item, parse_buffer * const input_buffer)
{
    if ((input_buffer == NULL) || (input_buffer->content == NULL))
    {
        return false; /* no input */
    }

    /* parse the different types of values */
    /* null */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "null", 4) == 0))
    {
        item->type = cJSON_NULL;
        input_buffer->offset += 4;
        return true;
    }
    /* false */
    if (can_read(input_buffer, 5) && (strncmp((const char*)buffer_at_offset(input_buffer), "false", 5) == 0))
    {
        item->type = cJSON_False;
        input_buffer->offset += 5;
        return true;
    }
    /* true */
    if (can_read(input_buffer, 4) && (strncmp((const char*)buffer_at_offset(input_buffer), "true", 4) == 0))
    {
        item->type = cJSON_True;
        item->valueint = 1;
        input_buffer->offset += 4;
        return true;
    }
    /* string */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '\"'))
    {
        return parse_string(item, input_buffer);
    }
    /* number */
    if (can_access_at_index(input_buffer, 0) && ((buffer_at_offset(input_buffer)[0] == '-') || ((buffer_at_offset(input_buffer)[0] >= '0') && (buffer_at_offset(input_buffer)[0] <= '9'))))
    {
        return parse_number(item, input_buffer);
    }
    /* array */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '['))
    {
        return parse_array(item, input_buffer);
    }
    /* object */
    if (can_access_at_index(input_buffer, 0) && (buffer_at_offset(input_buffer)[0] == '{'))
    {
        return parse_object(item, input_buffer);
    }


    return false;
}